

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

cmpResult __thiscall llvm::detail::IEEEFloat::compare(IEEEFloat *this,IEEEFloat *rhs)

{
  cmpResult local_24;
  cmpResult result;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  if (this->semantics == rhs->semantics) {
    switch((rhs->field_0x12 & 7) + (this->field_0x12 & 7) * '\x04') {
    case 0:
      if (((byte)this->field_0x12 >> 3 & 1) == ((byte)rhs->field_0x12 >> 3 & 1)) {
        this_local._4_4_ = cmpEqual;
      }
      else if (((byte)this->field_0x12 >> 3 & 1) == 0) {
        this_local._4_4_ = cmpGreaterThan;
      }
      else {
        this_local._4_4_ = cmpLessThan;
      }
      break;
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 9:
    case 0xd:
      this_local._4_4_ = cmpUnordered;
      break;
    case 2:
    case 3:
    case 0xb:
      if (((byte)this->field_0x12 >> 3 & 1) == 0) {
        this_local._4_4_ = cmpGreaterThan;
      }
      else {
        this_local._4_4_ = cmpLessThan;
      }
      break;
    case 8:
    case 0xc:
    case 0xe:
      if (((byte)rhs->field_0x12 >> 3 & 1) == 0) {
        this_local._4_4_ = cmpLessThan;
      }
      else {
        this_local._4_4_ = cmpGreaterThan;
      }
      break;
    case 10:
      if (((byte)this->field_0x12 >> 3 & 1) == ((byte)rhs->field_0x12 >> 3 & 1)) {
        local_24 = compareAbsoluteValue(this,rhs);
        if (((byte)this->field_0x12 >> 3 & 1) != 0) {
          if (local_24 == cmpLessThan) {
            local_24 = cmpGreaterThan;
          }
          else if (local_24 == cmpGreaterThan) {
            local_24 = cmpLessThan;
          }
        }
      }
      else if (((byte)this->field_0x12 >> 3 & 1) == 0) {
        local_24 = cmpGreaterThan;
      }
      else {
        local_24 = cmpLessThan;
      }
      this_local._4_4_ = local_24;
      break;
    case 0xf:
      this_local._4_4_ = cmpEqual;
      break;
    default:
      llvm_unreachable_internal
                ((char *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0x744);
    }
    return this_local._4_4_;
  }
  __assert_fail("semantics == rhs.semantics",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x740,
                "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compare(const IEEEFloat &) const");
}

Assistant:

IEEEFloat::cmpResult IEEEFloat::compare(const IEEEFloat &rhs) const {
  cmpResult result;

  assert(semantics == rhs.semantics);

  switch (PackCategoriesIntoKey(category, rhs.category)) {
  default:
    llvm_unreachable(nullptr);

  case PackCategoriesIntoKey(fcNaN, fcZero):
  case PackCategoriesIntoKey(fcNaN, fcNormal):
  case PackCategoriesIntoKey(fcNaN, fcInfinity):
  case PackCategoriesIntoKey(fcNaN, fcNaN):
  case PackCategoriesIntoKey(fcZero, fcNaN):
  case PackCategoriesIntoKey(fcNormal, fcNaN):
  case PackCategoriesIntoKey(fcInfinity, fcNaN):
    return cmpUnordered;

  case PackCategoriesIntoKey(fcInfinity, fcNormal):
  case PackCategoriesIntoKey(fcInfinity, fcZero):
  case PackCategoriesIntoKey(fcNormal, fcZero):
    if (sign)
      return cmpLessThan;
    else
      return cmpGreaterThan;

  case PackCategoriesIntoKey(fcNormal, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcInfinity):
  case PackCategoriesIntoKey(fcZero, fcNormal):
    if (rhs.sign)
      return cmpGreaterThan;
    else
      return cmpLessThan;

  case PackCategoriesIntoKey(fcInfinity, fcInfinity):
    if (sign == rhs.sign)
      return cmpEqual;
    else if (sign)
      return cmpLessThan;
    else
      return cmpGreaterThan;

  case PackCategoriesIntoKey(fcZero, fcZero):
    return cmpEqual;

  case PackCategoriesIntoKey(fcNormal, fcNormal):
    break;
  }

  /* Two normal numbers.  Do they have the same sign?  */
  if (sign != rhs.sign) {
    if (sign)
      result = cmpLessThan;
    else
      result = cmpGreaterThan;
  } else {
    /* Compare absolute values; invert result if negative.  */
    result = compareAbsoluteValue(rhs);

    if (sign) {
      if (result == cmpLessThan)
        result = cmpGreaterThan;
      else if (result == cmpGreaterThan)
        result = cmpLessThan;
    }
  }

  return result;
}